

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetViewports
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 NumViewports,
          Viewport *pViewports,Uint32 *RTWidth,Uint32 *RTHeight)

{
  String *__return_storage_ptr__;
  Uint32 UVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Char *pCVar4;
  RenderDeviceVkImpl *this_00;
  DeviceFeatures *pDVar5;
  uint *puVar6;
  Viewport *pVVar7;
  Uint32 *pUVar8;
  COMMAND_QUEUE_TYPE Type;
  char *pcVar9;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe08) [2];
  undefined1 local_1a0 [8];
  string msg_8;
  string msg_7;
  string msg_6;
  undefined1 local_138 [4];
  Uint32 vp;
  string msg_5;
  Viewport DefaultVP;
  string msg_4;
  string msg_3;
  undefined1 local_a0 [8];
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  Uint32 *RTHeight_local;
  Uint32 *RTWidth_local;
  Viewport *pViewports_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *pDStack_10;
  Uint32 NumViewports_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = RTHeight;
  pViewports_local._4_4_ = NumViewports;
  pDStack_10 = this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar2 = IsDeferred(this);
    if (!bVar2) {
      FormatString<char[79]>
                ((string *)local_50,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x390);
      std::__cxx11::string::~string((string *)local_50);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    pcVar9 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a0,(Diligent *)"SetViewports",(char (*) [13])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x390);
    std::__cxx11::string::~string((string *)local_a0);
    RTHeight = (Uint32 *)pcVar9;
  }
  if (1 < pViewports_local._4_4_) {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
    pDVar5 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
    if (pDVar5->MultiViewport == DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[77]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [77])
                 "IDeviceContext::SetViewports: multi viewport is not supported by this device");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x395);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
  }
  if ((*RTWidth == 0) || (*(int *)msg.field_2._8_8_ == 0)) {
    *RTWidth = this->m_FramebufferWidth;
    *(Uint32 *)msg.field_2._8_8_ = this->m_FramebufferHeight;
  }
  if (0xf < pViewports_local._4_4_) {
    RTHeight = &MAX_VIEWPORTS;
    FormatString<char[22],unsigned_int,char[22],unsigned_int,char[2]>
              ((string *)&DefaultVP.MinDepth,(Diligent *)"Number of viewports (",
               (char (*) [22])((long)&pViewports_local + 4),(uint *)") exceeds the limit (",
               (char (*) [22])&MAX_VIEWPORTS,(uint *)0xcabce5,in_stack_fffffffffffffe08);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x39d);
    std::__cxx11::string::~string((string *)&DefaultVP.MinDepth);
  }
  puVar6 = std::min<unsigned_int>(&MAX_VIEWPORTS,(uint *)((long)&pViewports_local + 4));
  this->m_NumViewports = *puVar6;
  Viewport::Viewport((Viewport *)((long)&msg_5.field_2 + 8),*RTWidth,*(Uint32 *)msg.field_2._8_8_,
                     0.0,1.0);
  RTWidth_local = (Uint32 *)pViewports;
  if ((this->m_NumViewports == 1) && (pViewports == (Viewport *)0x0)) {
    RTWidth_local = (Uint32 *)(msg_5.field_2._M_local_buf + 8);
  }
  if (RTWidth_local == (Uint32 *)0x0) {
    FormatString<char[28]>((string *)local_138,(char (*) [28])"pViewports must not be null");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x3a6);
    std::__cxx11::string::~string((string *)local_138);
  }
  for (msg_6.field_2._12_4_ = 0; (uint)msg_6.field_2._12_4_ < this->m_NumViewports;
      msg_6.field_2._12_4_ = msg_6.field_2._12_4_ + 1) {
    pUVar8 = RTWidth_local + (ulong)(uint)msg_6.field_2._12_4_ * 6;
    pVVar7 = this->m_Viewports + (uint)msg_6.field_2._12_4_;
    UVar1 = pUVar8[1];
    pVVar7->TopLeftX = (Float32)pUVar8[0];
    pVVar7->TopLeftY = (Float32)UVar1;
    UVar1 = pUVar8[3];
    pVVar7->Width = (Float32)pUVar8[2];
    pVVar7->Height = (Float32)UVar1;
    UVar1 = pUVar8[5];
    pVVar7->MinDepth = (Float32)pUVar8[4];
    pVVar7->MaxDepth = (Float32)UVar1;
    if ((float)this->m_Viewports[(uint)msg_6.field_2._12_4_].Width < 0.0) {
      FormatString<char[27],float,char[2]>
                ((string *)((long)&msg_7.field_2 + 8),(Diligent *)"Incorrect viewport width (",
                 (char (*) [27])&this->m_Viewports[(uint)msg_6.field_2._12_4_].Width,
                 (float *)0xcabce5,(char (*) [2])RTHeight);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ab);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
    if ((float)this->m_Viewports[(uint)msg_6.field_2._12_4_].Height < 0.0) {
      FormatString<char[28],float,char[2]>
                ((string *)((long)&msg_8.field_2 + 8),(Diligent *)"Incorrect viewport height (",
                 (char (*) [28])&this->m_Viewports[(uint)msg_6.field_2._12_4_].Height,
                 (float *)0xcabce5,(char (*) [2])RTHeight);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ac);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    if ((float)this->m_Viewports[(uint)msg_6.field_2._12_4_].MaxDepth <
        (float)this->m_Viewports[(uint)msg_6.field_2._12_4_].MinDepth) {
      RTHeight = (Uint32 *)&this->m_Viewports[(uint)msg_6.field_2._12_4_].MaxDepth;
      FormatString<char[33],float,char[3],float,char[2]>
                ((string *)local_1a0,(Diligent *)"Incorrect viewport depth range [",
                 (char (*) [33])&this->m_Viewports[(uint)msg_6.field_2._12_4_].MinDepth,
                 (float *)0xd26306,(char (*) [3])RTHeight,(float *)0xcda7a6,
                 in_stack_fffffffffffffe08);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"SetViewports",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x3ad);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  (this->m_Stats).CommandCounters.SetViewports = (this->m_Stats).CommandCounters.SetViewports + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetViewports(
    Uint32          NumViewports,
    const Viewport* pViewports,
    Uint32&         RTWidth,
    Uint32&         RTHeight)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetViewports");

    if (NumViewports > 1)
    {
        DEV_CHECK_ERR(m_pDevice->GetFeatures().MultiViewport,
                      "IDeviceContext::SetViewports: multi viewport is not supported by this device");
    }
    if (RTWidth == 0 || RTHeight == 0)
    {
        RTWidth  = m_FramebufferWidth;
        RTHeight = m_FramebufferHeight;
    }

    DEV_CHECK_ERR(NumViewports < MAX_VIEWPORTS, "Number of viewports (", NumViewports, ") exceeds the limit (", MAX_VIEWPORTS, ")");
    m_NumViewports = (std::min)(MAX_VIEWPORTS, NumViewports);

    Viewport DefaultVP{RTWidth, RTHeight};
    // If no viewports are specified, use default viewport
    if (m_NumViewports == 1 && pViewports == nullptr)
    {
        pViewports = &DefaultVP;
    }
    DEV_CHECK_ERR(pViewports != nullptr, "pViewports must not be null");

    for (Uint32 vp = 0; vp < m_NumViewports; ++vp)
    {
        m_Viewports[vp] = pViewports[vp];
        DEV_CHECK_ERR(m_Viewports[vp].Width >= 0, "Incorrect viewport width (", m_Viewports[vp].Width, ")");
        DEV_CHECK_ERR(m_Viewports[vp].Height >= 0, "Incorrect viewport height (", m_Viewports[vp].Height, ")");
        DEV_CHECK_ERR(m_Viewports[vp].MaxDepth >= m_Viewports[vp].MinDepth, "Incorrect viewport depth range [", m_Viewports[vp].MinDepth, ", ", m_Viewports[vp].MaxDepth, "]");
    }

    ++m_Stats.CommandCounters.SetViewports;
}